

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O2

void __thiscall Catch::XmlReporter::testRunStarting(XmlReporter *this,TestRunInfo *testInfo)

{
  XmlWriter *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  size_type sVar3;
  int iVar4;
  undefined4 extraout_var;
  XmlWriter *pXVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_type extraout_RDX;
  StringRef url;
  StringRef name;
  StringRef name_00;
  StringRef name_01;
  StringRef name_02;
  StringRef name_03;
  StringRef attribute;
  allocator<char> local_61;
  int local_60;
  uint local_5c;
  string local_58;
  string stylesheetRef;
  
  uVar1 = *(undefined4 *)((long)&(testInfo->name).m_start + 4);
  sVar3 = (testInfo->name).m_size;
  uVar2 = *(undefined4 *)((long)&(testInfo->name).m_size + 4);
  *(undefined4 *)&(this->super_StreamingReporterBase).currentTestRunInfo.name.m_start =
       *(undefined4 *)&(testInfo->name).m_start;
  *(undefined4 *)((long)&(this->super_StreamingReporterBase).currentTestRunInfo.name.m_start + 4) =
       uVar1;
  *(int *)&(this->super_StreamingReporterBase).currentTestRunInfo.name.m_size = (int)sVar3;
  *(undefined4 *)((long)&(this->super_StreamingReporterBase).currentTestRunInfo.name.m_size + 4) =
       uVar2;
  (*(this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener._vptr_IEventListener
    [0x18])(&stylesheetRef,this);
  if (stylesheetRef._M_string_length != 0) {
    url.m_size = stylesheetRef._M_string_length;
    url.m_start = stylesheetRef._M_dataplus._M_p;
    XmlWriter::writeStylesheetRef(&this->m_xml,url);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Catch2TestRun",&local_61);
  this_00 = &this->m_xml;
  XmlWriter::startElement(this_00,&local_58,Newline|Indent);
  iVar4 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[3])();
  attribute.m_start._4_4_ = extraout_var;
  attribute.m_start._0_4_ = iVar4;
  name.m_size = 4;
  name.m_start = "name";
  attribute.m_size = extraout_RDX;
  XmlWriter::writeAttribute(this_00,name,attribute);
  local_5c = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config
               )->_vptr_IConfig[0x11])();
  name_00.m_size = 8;
  name_00.m_start = "rng-seed";
  pXVar5 = XmlWriter::writeAttribute<unsigned_int,void>(this_00,name_00,&local_5c);
  local_60 = 3;
  name_01.m_size = 0x12;
  name_01.m_start = "xml-format-version";
  pXVar5 = XmlWriter::writeAttribute<int,void>(pXVar5,name_01,&local_60);
  libraryVersion();
  name_02.m_size = 0xe;
  name_02.m_start = "catch2-version";
  XmlWriter::writeAttribute<Catch::Version,void>(pXVar5,name_02,&libraryVersion::version);
  std::__cxx11::string::~string((string *)&local_58);
  iVar4 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[0xd])();
  if (*(long *)CONCAT44(extraout_var_00,iVar4) != ((long *)CONCAT44(extraout_var_00,iVar4))[1]) {
    iVar4 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)
              ->_vptr_IConfig[0xd])();
    name_03.m_size = 7;
    name_03.m_start = "filters";
    XmlWriter::writeAttribute<Catch::TestSpec,void>
              (this_00,name_03,(TestSpec *)CONCAT44(extraout_var_01,iVar4));
  }
  std::__cxx11::string::~string((string *)&stylesheetRef);
  return;
}

Assistant:

void XmlReporter::testRunStarting( TestRunInfo const& testInfo ) {
        StreamingReporterBase::testRunStarting( testInfo );
        std::string stylesheetRef = getStylesheetRef();
        if( !stylesheetRef.empty() )
            m_xml.writeStylesheetRef( stylesheetRef );
        m_xml.startElement("Catch2TestRun")
             .writeAttribute("name"_sr, m_config->name())
             .writeAttribute("rng-seed"_sr, m_config->rngSeed())
             .writeAttribute("xml-format-version"_sr, 3)
             .writeAttribute("catch2-version"_sr, libraryVersion());
        if ( m_config->testSpec().hasFilters() ) {
            m_xml.writeAttribute( "filters"_sr, m_config->testSpec() );
        }
    }